

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_processor_xmi.cpp
# Opt level: O3

bool midi_processor::process_xmi_count
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *p_file,size_t *track_count)

{
  bool bVar1;
  uint uVar2;
  iff_chunk *piVar3;
  iff_stream xmi_file;
  iff_stream local_68;
  
  *track_count = 0;
  local_68.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.fail.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.fail.m_sub_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.fail.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.fail.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.fail.m_id[0] = '\0';
  local_68.fail.m_id[1] = '\0';
  local_68.fail.m_id[2] = '\0';
  local_68.fail.m_id[3] = '\0';
  local_68.fail.m_type[0] = '\0';
  local_68.fail.m_type[1] = '\0';
  local_68.fail.m_type[2] = '\0';
  local_68.fail.m_type[3] = '\0';
  local_68.m_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_chunks.super__Vector_base<iff_chunk,_std::allocator<iff_chunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar1 = read_iff_stream((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                          (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_start,
                          (iff_stream *)
                          (p_file->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          )._M_impl.super__Vector_impl_data._M_finish);
  if (bVar1) {
    piVar3 = iff_stream::find_chunk(&local_68,"FORM");
    if (*(int *)piVar3->m_type == 0x52494458) {
      piVar3 = iff_stream::find_chunk(&local_68,"CAT ");
      if (*(int *)piVar3->m_type == 0x44494d58) {
        uVar2 = iff_chunk::get_chunk_count(piVar3,"FORM");
        *track_count = (ulong)uVar2;
        bVar1 = true;
        goto LAB_0011206b;
      }
    }
  }
  bVar1 = false;
LAB_0011206b:
  std::vector<iff_chunk,_std::allocator<iff_chunk>_>::~vector(&local_68.fail.m_sub_chunks);
  if (local_68.fail.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.fail.m_data.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.fail.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.fail.m_data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<iff_chunk,_std::allocator<iff_chunk>_>::~vector(&local_68.m_chunks);
  return bVar1;
}

Assistant:

bool midi_processor::process_xmi_count( std::vector<uint8_t> const& p_file, size_t & track_count )
{
    track_count = 0;

    iff_stream xmi_file;
    if ( !read_iff_stream( p_file, xmi_file ) ) return false;

    const iff_chunk & form_chunk = xmi_file.find_chunk( "FORM" );
    if ( memcmp( form_chunk.m_type, "XDIR", 4 ) ) return false; /*throw exception_io_data( "XMI IFF not XDIR type" );*/

    const iff_chunk & cat_chunk = xmi_file.find_chunk( "CAT " );
    if ( memcmp( cat_chunk.m_type, "XMID", 4 ) ) return false; /*throw exception_io_data( "XMI CAT chunk not XMID type" );*/

    unsigned _track_count = cat_chunk.get_chunk_count( "FORM" );

    track_count = _track_count;

    return true;
}